

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

deUint32 __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampPerAxisCase3D::getCaseSeed
          (TextureBorderClampPerAxisCase3D *this)

{
  int iVar1;
  deUint32 dVar2;
  char *__s;
  SeedBuilder *pSVar3;
  Texture3D *pTVar4;
  Texture3D *pTVar5;
  allocator<char> local_39;
  string local_38;
  SeedBuilder local_14;
  TextureBorderClampPerAxisCase3D *pTStack_10;
  SeedBuilder builder;
  TextureBorderClampPerAxisCase3D *this_local;
  
  pTStack_10 = this;
  tcu::SeedBuilder::SeedBuilder(&local_14);
  __s = tcu::TestNode::getName((TestNode *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  pSVar3 = tcu::operator<<(&local_14,&local_38);
  pSVar3 = tcu::operator<<(pSVar3,this->m_texFormat);
  pSVar3 = tcu::operator<<(pSVar3,this->m_filter);
  pSVar3 = tcu::operator<<(pSVar3,this->m_sWrap);
  pSVar3 = tcu::operator<<(pSVar3,this->m_tWrap);
  pSVar3 = tcu::operator<<(pSVar3,this->m_rWrap);
  pTVar4 = de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::operator->
                     (&(this->m_texture).
                       super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>);
  pTVar5 = glu::Texture3D::getRefTexture(pTVar4);
  iVar1 = tcu::Texture3D::getWidth(pTVar5);
  pSVar3 = tcu::operator<<(pSVar3,iVar1);
  pTVar4 = de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::operator->
                     (&(this->m_texture).
                       super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>);
  pTVar5 = glu::Texture3D::getRefTexture(pTVar4);
  iVar1 = tcu::Texture3D::getHeight(pTVar5);
  pSVar3 = tcu::operator<<(pSVar3,iVar1);
  pTVar4 = de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::operator->
                     (&(this->m_texture).
                       super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>);
  pTVar5 = glu::Texture3D::getRefTexture(pTVar4);
  iVar1 = tcu::Texture3D::getDepth(pTVar5);
  tcu::operator<<(pSVar3,iVar1);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  dVar2 = tcu::SeedBuilder::get(&local_14);
  return dVar2;
}

Assistant:

deUint32 TextureBorderClampPerAxisCase3D::getCaseSeed (void) const
{
	tcu::SeedBuilder builder;
	builder	<< std::string(getName())
			<< m_texFormat
			<< m_filter
			<< m_sWrap
			<< m_tWrap
			<< m_rWrap
			<< m_texture->getRefTexture().getWidth()
			<< m_texture->getRefTexture().getHeight()
			<< m_texture->getRefTexture().getDepth();
	return builder.get();
}